

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable_comparison_suite.cpp
# Opt level: O0

void equality_suite::compare_map_equal_integer_literal(void)

{
  size_type sVar1;
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  *ppVar2;
  initializer_list<std::pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>_>
  init;
  initializer_list<std::pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>_>
  init_00;
  initializer_list<std::pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>_>
  init_01;
  initializer_list<std::pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>_>
  init_02;
  initializer_list<std::pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>_>
  init_03;
  initializer_list<std::pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>_>
  init_04;
  initializer_list<std::pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>_>
  init_05;
  initializer_list<std::pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>_>
  init_06;
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  *local_8a8;
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  *local_890;
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  *local_878;
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  *local_860;
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  *local_828;
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  *local_810;
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  *local_7f8;
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  *local_7e0;
  undefined1 local_7b5;
  int local_7b4;
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  *local_7b0;
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  local_7a8;
  undefined1 local_748 [65];
  undefined1 local_707 [2];
  undefined1 local_705;
  int local_704 [3];
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  local_6f8;
  undefined1 local_698 [65];
  undefined1 local_657 [2];
  undefined1 local_655;
  int local_654 [3];
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  local_648;
  undefined1 local_5e8 [65];
  undefined1 local_5a7 [2];
  undefined1 local_5a5;
  int local_5a4 [3];
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  local_598;
  undefined1 local_538 [77];
  undefined1 local_4eb [2];
  undefined1 local_4e9;
  basic_variable<std::allocator<char>_> local_4e8;
  undefined1 local_4ab [2];
  undefined1 local_4a9;
  basic_variable<std::allocator<char>_> local_4a8;
  undefined1 local_46b [2];
  undefined1 local_469;
  basic_variable<std::allocator<char>_> local_468;
  undefined1 local_42b [2];
  undefined1 local_429;
  basic_variable<std::allocator<char>_> local_428;
  undefined1 local_3f2 [2];
  uint local_3f0 [2];
  uint big_1;
  uint zero_1;
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  *local_3e0;
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  local_3d8;
  undefined1 local_378 [65];
  undefined1 local_337 [2];
  undefined1 local_335;
  int local_334 [3];
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  local_328;
  undefined1 local_2c8 [65];
  undefined1 local_287 [2];
  undefined1 local_285;
  int local_284 [3];
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  local_278;
  undefined1 local_218 [65];
  undefined1 local_1d7 [2];
  undefined1 local_1d5;
  int local_1d4 [3];
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  local_1c8;
  undefined1 local_168 [77];
  undefined1 local_11b [2];
  undefined1 local_119;
  basic_variable<std::allocator<char>_> local_118;
  undefined1 local_db [2];
  undefined1 local_d9;
  basic_variable<std::allocator<char>_> local_d8;
  undefined1 local_9b [2];
  undefined1 local_99;
  basic_variable<std::allocator<char>_> local_98;
  undefined1 local_5e [21];
  undefined1 local_49;
  basic_variable<std::allocator<char>_> local_48;
  undefined1 local_12 [2];
  int local_10 [2];
  int big;
  int zero;
  
  local_10[1] = 0;
  local_10[0] = 0x7fffffff;
  trial::dynamic::basic_map<std::allocator<char>_>::make();
  local_12[0] = trial::dynamic::operator==(&local_48,local_10 + 1);
  local_49 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("map::make() == zero","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0xdfb,"void equality_suite::compare_map_equal_integer_literal()",local_12,&local_49);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_48);
  trial::dynamic::basic_map<std::allocator<char>_>::make();
  local_5e[0] = trial::dynamic::operator!=(&local_98,local_10 + 1);
  local_99 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("map::make() != zero","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0xdfc,"void equality_suite::compare_map_equal_integer_literal()",local_5e,&local_99);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_98);
  trial::dynamic::basic_map<std::allocator<char>_>::make();
  local_9b[0] = trial::dynamic::operator==(&local_d8,local_10);
  local_d9 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("map::make() == big","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0xdfd,"void equality_suite::compare_map_equal_integer_literal()",local_9b,&local_d9);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_d8);
  trial::dynamic::basic_map<std::allocator<char>_>::make();
  local_db[0] = trial::dynamic::operator!=(&local_118,local_10);
  local_119 = '\x01';
  sVar1 = 0xdfe;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("map::make() != big","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0xdfe,"void equality_suite::compare_map_equal_integer_literal()",local_db,&local_119);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_118);
  local_1d4._4_8_ = &local_1c8;
  local_1d4[0] = 1;
  std::
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  ::pair<const_char_(&)[6],_int,_true>
            ((pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              *)local_1d4._4_8_,(char (*) [6])"alpha",local_1d4);
  local_168._0_8_ = &local_1c8;
  local_168._8_8_ = 1;
  init._M_len = sVar1;
  init._M_array = (iterator)0x1;
  trial::dynamic::basic_map<std::allocator<char>_>::make
            ((basic_variable<std::allocator<char>_> *)(local_168 + 0x10),
             (basic_map<std::allocator<char>_> *)local_168._0_8_,init);
  local_11b[0] = trial::dynamic::operator==
                           ((basic_variable<std::allocator<char>_> *)(local_168 + 0x10),local_10 + 1
                           );
  local_1d5 = '\0';
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("map::make({ {\"alpha\", 1} }) == zero","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0xe00,"void equality_suite::compare_map_equal_integer_literal()",local_11b,&local_1d5)
  ;
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_168 + 0x10));
  ppVar2 = &local_1c8;
  local_7e0 = (pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
               *)local_168;
  do {
    local_7e0 = local_7e0 + -1;
    std::
    pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
    ::~pair(local_7e0);
  } while (local_7e0 != ppVar2);
  local_284._4_8_ = &local_278;
  local_284[0] = 1;
  std::
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  ::pair<const_char_(&)[6],_int,_true>
            ((pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              *)local_284._4_8_,(char (*) [6])"alpha",local_284);
  local_218._0_8_ = &local_278;
  local_218._8_8_ = 1;
  init_00._M_len = (size_type)ppVar2;
  init_00._M_array = (iterator)0x1;
  trial::dynamic::basic_map<std::allocator<char>_>::make
            ((basic_variable<std::allocator<char>_> *)(local_218 + 0x10),
             (basic_map<std::allocator<char>_> *)local_218._0_8_,init_00);
  local_1d7[0] = trial::dynamic::operator!=
                           ((basic_variable<std::allocator<char>_> *)(local_218 + 0x10),local_10 + 1
                           );
  local_285 = '\x01';
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("map::make({ {\"alpha\", 1} }) != zero","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0xe01,"void equality_suite::compare_map_equal_integer_literal()",local_1d7,&local_285)
  ;
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_218 + 0x10));
  ppVar2 = &local_278;
  local_7f8 = (pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
               *)local_218;
  do {
    local_7f8 = local_7f8 + -1;
    std::
    pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
    ::~pair(local_7f8);
  } while (local_7f8 != ppVar2);
  local_334._4_8_ = &local_328;
  local_334[0] = 1;
  std::
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  ::pair<const_char_(&)[6],_int,_true>
            ((pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              *)local_334._4_8_,(char (*) [6])"alpha",local_334);
  local_2c8._0_8_ = &local_328;
  local_2c8._8_8_ = 1;
  init_01._M_len = (size_type)ppVar2;
  init_01._M_array = (iterator)0x1;
  trial::dynamic::basic_map<std::allocator<char>_>::make
            ((basic_variable<std::allocator<char>_> *)(local_2c8 + 0x10),
             (basic_map<std::allocator<char>_> *)local_2c8._0_8_,init_01);
  local_287[0] = trial::dynamic::operator==
                           ((basic_variable<std::allocator<char>_> *)(local_2c8 + 0x10),local_10);
  local_335 = '\0';
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("map::make({ {\"alpha\", 1} }) == big","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0xe02,"void equality_suite::compare_map_equal_integer_literal()",local_287,&local_335)
  ;
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_2c8 + 0x10));
  ppVar2 = &local_328;
  local_810 = (pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
               *)local_2c8;
  do {
    local_810 = local_810 + -1;
    std::
    pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
    ::~pair(local_810);
  } while (local_810 != ppVar2);
  local_3e0 = &local_3d8;
  zero_1 = 1;
  std::
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  ::pair<const_char_(&)[6],_int,_true>(local_3e0,(char (*) [6])"alpha",(int *)&zero_1);
  local_378._0_8_ = &local_3d8;
  local_378._8_8_ = 1;
  init_02._M_len = (size_type)ppVar2;
  init_02._M_array = (iterator)0x1;
  trial::dynamic::basic_map<std::allocator<char>_>::make
            ((basic_variable<std::allocator<char>_> *)(local_378 + 0x10),
             (basic_map<std::allocator<char>_> *)local_378._0_8_,init_02);
  local_337[0] = trial::dynamic::operator!=
                           ((basic_variable<std::allocator<char>_> *)(local_378 + 0x10),local_10);
  big_1._3_1_ = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("map::make({ {\"alpha\", 1} }) != big","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0xe03,"void equality_suite::compare_map_equal_integer_literal()",local_337,
             (long)&big_1 + 3);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_378 + 0x10));
  local_828 = (pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
               *)local_378;
  do {
    local_828 = local_828 + -1;
    std::
    pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
    ::~pair(local_828);
  } while (local_828 != &local_3d8);
  local_3f0[1] = 0;
  local_3f0[0] = 0xffffffff;
  trial::dynamic::basic_map<std::allocator<char>_>::make();
  local_3f2[0] = trial::dynamic::operator==(&local_428,local_3f0 + 1);
  local_429 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("map::make() == zero","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0xe09,"void equality_suite::compare_map_equal_integer_literal()",local_3f2,&local_429)
  ;
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_428);
  trial::dynamic::basic_map<std::allocator<char>_>::make();
  local_42b[0] = trial::dynamic::operator!=(&local_468,local_3f0 + 1);
  local_469 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("map::make() != zero","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0xe0a,"void equality_suite::compare_map_equal_integer_literal()",local_42b,&local_469)
  ;
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_468);
  trial::dynamic::basic_map<std::allocator<char>_>::make();
  local_46b[0] = trial::dynamic::operator==(&local_4a8,local_3f0);
  local_4a9 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("map::make() == big","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0xe0b,"void equality_suite::compare_map_equal_integer_literal()",local_46b,&local_4a9)
  ;
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_4a8);
  trial::dynamic::basic_map<std::allocator<char>_>::make();
  local_4ab[0] = trial::dynamic::operator!=(&local_4e8,local_3f0);
  local_4e9 = '\x01';
  sVar1 = 0xe0c;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("map::make() != big","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0xe0c,"void equality_suite::compare_map_equal_integer_literal()",local_4ab,&local_4e9)
  ;
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_4e8);
  local_5a4._4_8_ = &local_598;
  local_5a4[0] = 1;
  std::
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  ::pair<const_char_(&)[6],_int,_true>
            ((pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              *)local_5a4._4_8_,(char (*) [6])"alpha",local_5a4);
  local_538._0_8_ = &local_598;
  local_538._8_8_ = 1;
  init_03._M_len = sVar1;
  init_03._M_array = (iterator)0x1;
  trial::dynamic::basic_map<std::allocator<char>_>::make
            ((basic_variable<std::allocator<char>_> *)(local_538 + 0x10),
             (basic_map<std::allocator<char>_> *)local_538._0_8_,init_03);
  local_4eb[0] = trial::dynamic::operator==
                           ((basic_variable<std::allocator<char>_> *)(local_538 + 0x10),
                            local_3f0 + 1);
  local_5a5 = '\0';
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("map::make({ {\"alpha\", 1} }) == zero","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0xe0e,"void equality_suite::compare_map_equal_integer_literal()",local_4eb,&local_5a5)
  ;
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_538 + 0x10));
  ppVar2 = &local_598;
  local_860 = (pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
               *)local_538;
  do {
    local_860 = local_860 + -1;
    std::
    pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
    ::~pair(local_860);
  } while (local_860 != ppVar2);
  local_654._4_8_ = &local_648;
  local_654[0] = 1;
  std::
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  ::pair<const_char_(&)[6],_int,_true>
            ((pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              *)local_654._4_8_,(char (*) [6])"alpha",local_654);
  local_5e8._0_8_ = &local_648;
  local_5e8._8_8_ = 1;
  init_04._M_len = (size_type)ppVar2;
  init_04._M_array = (iterator)0x1;
  trial::dynamic::basic_map<std::allocator<char>_>::make
            ((basic_variable<std::allocator<char>_> *)(local_5e8 + 0x10),
             (basic_map<std::allocator<char>_> *)local_5e8._0_8_,init_04);
  local_5a7[0] = trial::dynamic::operator!=
                           ((basic_variable<std::allocator<char>_> *)(local_5e8 + 0x10),
                            local_3f0 + 1);
  local_655 = '\x01';
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("map::make({ {\"alpha\", 1} }) != zero","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0xe0f,"void equality_suite::compare_map_equal_integer_literal()",local_5a7,&local_655)
  ;
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_5e8 + 0x10));
  ppVar2 = &local_648;
  local_878 = (pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
               *)local_5e8;
  do {
    local_878 = local_878 + -1;
    std::
    pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
    ::~pair(local_878);
  } while (local_878 != ppVar2);
  local_704._4_8_ = &local_6f8;
  local_704[0] = 1;
  std::
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  ::pair<const_char_(&)[6],_int,_true>
            ((pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              *)local_704._4_8_,(char (*) [6])"alpha",local_704);
  local_698._0_8_ = &local_6f8;
  local_698._8_8_ = 1;
  init_05._M_len = (size_type)ppVar2;
  init_05._M_array = (iterator)0x1;
  trial::dynamic::basic_map<std::allocator<char>_>::make
            ((basic_variable<std::allocator<char>_> *)(local_698 + 0x10),
             (basic_map<std::allocator<char>_> *)local_698._0_8_,init_05);
  local_657[0] = trial::dynamic::operator==
                           ((basic_variable<std::allocator<char>_> *)(local_698 + 0x10),local_3f0);
  local_705 = '\0';
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("map::make({ {\"alpha\", 1} }) == big","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0xe10,"void equality_suite::compare_map_equal_integer_literal()",local_657,&local_705)
  ;
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_698 + 0x10));
  ppVar2 = &local_6f8;
  local_890 = (pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
               *)local_698;
  do {
    local_890 = local_890 + -1;
    std::
    pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
    ::~pair(local_890);
  } while (local_890 != ppVar2);
  local_7b0 = &local_7a8;
  local_7b4 = 1;
  std::
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  ::pair<const_char_(&)[6],_int,_true>(local_7b0,(char (*) [6])"alpha",&local_7b4);
  local_748._0_8_ = &local_7a8;
  local_748._8_8_ = 1;
  init_06._M_len = (size_type)ppVar2;
  init_06._M_array = (iterator)0x1;
  trial::dynamic::basic_map<std::allocator<char>_>::make
            ((basic_variable<std::allocator<char>_> *)(local_748 + 0x10),
             (basic_map<std::allocator<char>_> *)local_748._0_8_,init_06);
  local_707[0] = trial::dynamic::operator!=
                           ((basic_variable<std::allocator<char>_> *)(local_748 + 0x10),local_3f0);
  local_7b5 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("map::make({ {\"alpha\", 1} }) != big","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0xe11,"void equality_suite::compare_map_equal_integer_literal()",local_707,&local_7b5)
  ;
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_748 + 0x10));
  local_8a8 = (pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
               *)local_748;
  do {
    local_8a8 = local_8a8 + -1;
    std::
    pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
    ::~pair(local_8a8);
  } while (local_8a8 != &local_7a8);
  return;
}

Assistant:

void compare_map_equal_integer_literal()
{
    {
        const auto zero = 0;
        const auto big = std::numeric_limits<signed int>::max();

        TRIAL_PROTOCOL_TEST_EQUAL(map::make() == zero, false);
        TRIAL_PROTOCOL_TEST_EQUAL(map::make() != zero, true);
        TRIAL_PROTOCOL_TEST_EQUAL(map::make() == big, false);
        TRIAL_PROTOCOL_TEST_EQUAL(map::make() != big, true);

        TRIAL_PROTOCOL_TEST_EQUAL(map::make({ {"alpha", 1} }) == zero, false);
        TRIAL_PROTOCOL_TEST_EQUAL(map::make({ {"alpha", 1} }) != zero, true);
        TRIAL_PROTOCOL_TEST_EQUAL(map::make({ {"alpha", 1} }) == big, false);
        TRIAL_PROTOCOL_TEST_EQUAL(map::make({ {"alpha", 1} }) != big, true);
    }
    {
        const auto zero = 0U;
        const auto big = std::numeric_limits<unsigned int>::max();

        TRIAL_PROTOCOL_TEST_EQUAL(map::make() == zero, false);
        TRIAL_PROTOCOL_TEST_EQUAL(map::make() != zero, true);
        TRIAL_PROTOCOL_TEST_EQUAL(map::make() == big, false);
        TRIAL_PROTOCOL_TEST_EQUAL(map::make() != big, true);

        TRIAL_PROTOCOL_TEST_EQUAL(map::make({ {"alpha", 1} }) == zero, false);
        TRIAL_PROTOCOL_TEST_EQUAL(map::make({ {"alpha", 1} }) != zero, true);
        TRIAL_PROTOCOL_TEST_EQUAL(map::make({ {"alpha", 1} }) == big, false);
        TRIAL_PROTOCOL_TEST_EQUAL(map::make({ {"alpha", 1} }) != big, true);
    }
}